

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synth_core.cpp
# Opt level: O3

void __thiscall V2Voice::noteOn(V2Voice *this,int note,int vel)

{
  V2Instance *pVVar1;
  V2Flt *pVVar2;
  bool bVar3;
  bool bVar4;
  int i;
  long lVar5;
  V2Osc *this_00;
  float fVar6;
  float fVar7;
  
  this->note = note;
  fVar6 = (float)note + this->xpose;
  this->osc[0].note = fVar6;
  this->osc[1].note = fVar6;
  this->osc[2].note = fVar6;
  this->velo = (float)vel;
  this->gate = true;
  this->env[0].state = ATTACK;
  this->env[1].state = ATTACK;
  if (this->keysync != 1) {
    if (this->keysync != 2) goto LAB_0010bf08;
    lVar5 = 0;
    this->env[0].val = 0.0;
    this->env[1].val = 0.0;
    this->curvol = 0.0;
    this_00 = this->osc;
    do {
      V2Osc::init(this_00,(EVP_PKEY_CTX *)this->inst);
      lVar5 = lVar5 + 1;
      this_00 = this_00 + 1;
    } while (lVar5 != 3);
    pVVar1 = this->inst;
    this->vcf[0].lrc.l = 0.0;
    this->vcf[0].lrc.b = 0.0;
    this->vcf[0].moog.b[0] = 0.0;
    this->vcf[0].moog.b[1] = 0.0;
    this->vcf[0].moog.b[1] = 0.0;
    this->vcf[0].moog.b[2] = 0.0;
    this->vcf[0].moog.b[3] = 0.0;
    this->vcf[0].moog.b[4] = 0.0;
    this->vcf[0].inst = pVVar1;
    this->vcf[1].lrc.l = 0.0;
    this->vcf[1].lrc.b = 0.0;
    this->vcf[1].moog.b[0] = 0.0;
    this->vcf[1].moog.b[1] = 0.0;
    this->vcf[1].moog.b[1] = 0.0;
    this->vcf[1].moog.b[2] = 0.0;
    this->vcf[1].moog.b[3] = 0.0;
    this->vcf[1].moog.b[4] = 0.0;
    this->vcf[1].inst = pVVar1;
    (this->dist).dcount = 0;
    (this->dist).dvall = 0.0;
    (this->dist).dvalr = 0.0;
    (this->dist).fltl.lrc.l = 0.0;
    (this->dist).fltl.lrc.b = 0.0;
    (this->dist).fltl.moog.b[0] = 0.0;
    (this->dist).fltl.moog.b[1] = 0.0;
    pVVar2 = &(this->dist).fltl;
    (pVVar2->moog).b[1] = 0.0;
    (pVVar2->moog).b[2] = 0.0;
    pVVar2 = &(this->dist).fltl;
    (pVVar2->moog).b[3] = 0.0;
    (pVVar2->moog).b[4] = 0.0;
    (this->dist).fltl.inst = pVVar1;
    (this->dist).fltr.lrc.l = 0.0;
    (this->dist).fltr.lrc.b = 0.0;
    (this->dist).fltr.moog.b[0] = 0.0;
    (this->dist).fltr.moog.b[1] = 0.0;
    pVVar2 = &(this->dist).fltr;
    (pVVar2->moog).b[1] = 0.0;
    (pVVar2->moog).b[2] = 0.0;
    pVVar2 = &(this->dist).fltr;
    (pVVar2->moog).b[3] = 0.0;
    (pVVar2->moog).b[4] = 0.0;
    (this->dist).fltr.inst = pVVar1;
  }
  this->osc[0].cnt = 0;
  this->osc[1].cnt = 0;
  this->osc[2].cnt = 0;
LAB_0010bf08:
  lVar5 = 0;
  do {
    fVar6 = *(float *)(*(long *)((long)&this->osc[0].inst + lVar5) + 8);
    fVar7 = exp2f(((*(float *)((long)&this->osc[0].pitch + lVar5) + 64.0) * 0.0078125 + -1.0) * 10.0
                 );
    *(float *)((long)&this->osc[0].nffrq + lVar5) = fVar7 * fVar6;
    fVar6 = *(float *)(*(long *)((long)&this->osc[0].inst + lVar5) + 4);
    fVar7 = exp2f((*(float *)((long)&this->osc[0].pitch + lVar5) +
                   *(float *)((long)&this->osc[0].note + lVar5) + -60.0) / 12.0);
    *(int *)((long)&this->osc[0].freq + lVar5) = (int)(fVar7 * fVar6);
    lVar5 = lVar5 + 0x40;
  } while (lVar5 != 0xc0);
  lVar5 = 0;
  bVar3 = true;
  do {
    bVar4 = bVar3;
    if (this->lfo[lVar5].sync == true) {
      this->lfo[lVar5].cntr = this->lfo[lVar5].cphase;
      this->lfo[lVar5].last = 0xffffffff;
    }
    lVar5 = 1;
    bVar3 = false;
  } while (bVar4);
  (this->dcf).inst = this->inst;
  (this->dcf).fl.xm1 = 0.0;
  (this->dcf).fl.ym1 = 0.0;
  (this->dcf).fr.xm1 = 0.0;
  (this->dcf).fr.ym1 = 0.0;
  return;
}

Assistant:

void noteOn(int note, int vel)
    {
        this->note = note;
        updateNote();

        velo = (float)vel;
        gate = true;

        // reset EGs
        for (int i=0; i < syVV2::NENV; i++)
            env[i].state = V2Env::ATTACK;

        // process sync
        switch (keysync)
        {
        case SYNC_FULL:
            COVER("VOICE noteOn sync full");
            for (int i=0; i < syVV2::NENV; i++)
                env[i].val = 0.0f;
            curvol = 0.0f;

            for (int i=0; i < syVV2::NOSC; i++)
                osc[i].init(inst, i);

            for (int i=0; i < syVV2::NFLT; i++)
                vcf[i].init(inst);

            dist.init(inst);
            // fall-through

        case SYNC_OSC:
            COVER("VOICE noteOn sync osc");
            for (int i=0; i < syVV2::NOSC; i++)
                osc[i].cnt = 0;
            // fall-through

        case SYNC_NONE:
        default:
            break;
        }

        for (int i=0; i < syVV2::NOSC; i++)
            osc[i].chgPitch();

        for (int i=0; i < syVV2::NLFO; i++)
            lfo[i].keyOn();

        dcf.init(inst);
    }